

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::
WalkConstSerialArenaChunk<google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(unsigned_long)::__0>
          (ThreadSafeArena *this,anon_class_16_2_396affc0 fn)

{
  bool bVar1;
  SerialArenaChunk *local_30;
  SerialArenaChunk *chunk;
  ThreadSafeArena *this_local;
  anon_class_16_2_396affc0 fn_local;
  
  fn_local.serial = (SerialArena **)fn.id;
  this_local = (ThreadSafeArena *)fn.serial;
  local_30 = std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::load
                       (&this->head_,memory_order_acquire);
  while( true ) {
    bVar1 = SerialArenaChunk::IsSentry(local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    fn_local.id = SerialArenaChunk::next_chunk(local_30);
    GetSerialArenaFallback::anon_class_16_2_396affc0::operator()
              ((anon_class_16_2_396affc0 *)&this_local,local_30);
    local_30 = SerialArenaChunk::next_chunk(local_30);
  }
  return;
}

Assistant:

void ThreadSafeArena::WalkConstSerialArenaChunk(Callback fn) const {
  const SerialArenaChunk* chunk = head_.load(std::memory_order_acquire);

  for (; !chunk->IsSentry(); chunk = chunk->next_chunk()) {
    // Prefetch the next chunk.
    absl::PrefetchToLocalCache(chunk->next_chunk());
    fn(chunk);
  }
}